

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<curi_status_const&>::
captureExpression<(Catch::Internal::Operator)0,curi_status>
          (ExpressionLhs<curi_status_const&> *this,anon_enum_32 *rhs)

{
  bool result;
  ExpressionResultBuilder *pEVar1;
  char *__s;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  anon_enum_32 *local_18;
  anon_enum_32 *rhs_local;
  ExpressionLhs<const_curi_status_&> *this_local;
  
  local_18 = rhs;
  rhs_local = (anon_enum_32 *)this;
  result = Internal::compare<(Catch::Internal::Operator)0,curi_status,curi_status>
                     (*(anon_enum_32 **)(this + 0x228),rhs);
  pEVar1 = ExpressionResultBuilder::setResultType((ExpressionResultBuilder *)this,result);
  toString<curi_status>(&local_38,*(anon_enum_32 **)(this + 0x228));
  pEVar1 = ExpressionResultBuilder::setLhs(pEVar1,&local_38);
  toString<curi_status>(&local_68,local_18);
  pEVar1 = ExpressionResultBuilder::setRhs(pEVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( const RhsT& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }